

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_folders.cpp
# Opt level: O0

void throwOnRelative(char *envName,char *envValue)

{
  runtime_error *this;
  char local_e8 [8];
  char buffer [200];
  char *envValue_local;
  char *envName_local;
  
  if (*envValue != '/') {
    snprintf(local_e8,200,
             "Environment \"%s\" does not start with an \'/\'. XDG specifies that the value must be absolute. The current value is: \"%s\""
             ,envName,envValue);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,local_e8);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

static void throwOnRelative(const char* envName, const char* envValue) {
	if (envValue[0] != '/') {
		char buffer[200];
		std::snprintf(buffer, sizeof(buffer), "Environment \"%s\" does not start with an '/'. XDG specifies that the value must be absolute. The current value is: \"%s\"", envName, envValue);
		throw std::runtime_error(buffer);
	}
}